

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O1

void __thiscall
AddressFactory_CheckAddressNetType_elements_Test::TestBody
          (AddressFactory_CheckAddressNetType_elements_Test *this)

{
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar1;
  bool bVar2;
  char *in_R9;
  AssertionResult gtest_ar__14;
  AddressFactory factory;
  Script script;
  Pubkey pubkey;
  Address addr;
  AssertHelper local_3b0;
  AssertHelper local_3a8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_3a0;
  AddressFactory local_388;
  Script local_360;
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  char local_308 [16];
  pointer local_2f8;
  pointer local_2e0;
  pointer local_2c8;
  TapBranch local_2b0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_238;
  Script local_220;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  Pubkey local_1b0;
  undefined1 local_198 [16];
  undefined1 local_188 [32];
  _Base_ptr local_168;
  pointer local_150;
  pointer local_138;
  TapBranch local_120;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_a8;
  Script local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  
  cfd::core::GetElementsAddressFormatList();
  cfd::AddressFactory::AddressFactory
            (&local_388,kLiquidV1,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_198);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_198);
  local_198._0_8_ = (pointer)local_188;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af","");
  cfd::core::Pubkey::Pubkey(&local_1b0,(string *)local_198);
  if ((pointer)local_198._0_8_ != (pointer)local_188) {
    operator_delete((void *)local_198._0_8_);
  }
  cfd::core::Address::Address((Address *)local_198);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2pkhAddress((Address *)local_328,&local_388,&local_1b0);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch(&local_2b0);
      if (local_2c8 != (pointer)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (pointer)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (pointer)0x0) {
        operator_delete(local_2f8);
      }
      if ((char *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1c6,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_360,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_360);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kMainnet);
  local_360._vptr_Script._0_1_ = !bVar2;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1c7,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3a0.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(*(long *)&((local_3a0.
                                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl + 8)
        )();
      }
      local_3a0.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kTestnet);
  local_360._vptr_Script._0_1_ = !bVar2;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1c8,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3a0.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(*(long *)&((local_3a0.
                                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl + 8)
        )();
      }
      local_3a0.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kRegtest);
  local_360._vptr_Script._0_1_ = !bVar2;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1c9,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3a0.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(*(long *)&((local_3a0.
                                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl + 8)
        )();
      }
      local_3a0.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_360._vptr_Script._0_1_ =
       cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kLiquidV1);
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (!(bool)local_360._vptr_Script._0_1_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ca,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3a0.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(*(long *)&((local_3a0.
                                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl + 8)
        )();
      }
      local_3a0.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kElementsRegtest)
  ;
  local_360._vptr_Script._0_1_ = !bVar2;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1cb,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3a0.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(*(long *)&((local_3a0.
                                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl + 8)
        )();
      }
      local_3a0.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_360._vptr_Script._0_1_ = !bVar2;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1cc,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3a0.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(*(long *)&((local_3a0.
                                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl + 8)
        )();
      }
      local_3a0.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_360._vptr_Script._0_1_ = !bVar2;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1cd,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3a0.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(*(long *)&((local_3a0.
                                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl + 8)
        )();
      }
      local_3a0.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2wpkhAddress((Address *)local_328,&local_388,&local_1b0);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch(&local_2b0);
      if (local_2c8 != (pointer)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (pointer)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (pointer)0x0) {
        operator_delete(local_2f8);
      }
      if ((char *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1cf,
               "Expected: addr = factory.CreateP2wpkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_360,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_360);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kMainnet);
  local_360._vptr_Script._0_1_ = !bVar2;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d0,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3a0.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(*(long *)&((local_3a0.
                                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl + 8)
        )();
      }
      local_3a0.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kTestnet);
  local_360._vptr_Script._0_1_ = !bVar2;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d1,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3a0.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(*(long *)&((local_3a0.
                                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl + 8)
        )();
      }
      local_3a0.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kRegtest);
  local_360._vptr_Script._0_1_ = !bVar2;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d2,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3a0.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(*(long *)&((local_3a0.
                                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl + 8)
        )();
      }
      local_3a0.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_360._vptr_Script._0_1_ =
       cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kLiquidV1);
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (!(bool)local_360._vptr_Script._0_1_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d3,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3a0.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(*(long *)&((local_3a0.
                                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl + 8)
        )();
      }
      local_3a0.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kElementsRegtest)
  ;
  local_360._vptr_Script._0_1_ = !bVar2;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d4,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3a0.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(*(long *)&((local_3a0.
                                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl + 8)
        )();
      }
      local_3a0.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_360._vptr_Script._0_1_ = !bVar2;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d5,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3a0.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(*(long *)&((local_3a0.
                                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl + 8)
        )();
      }
      local_3a0.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_360._vptr_Script._0_1_ = !bVar2;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d6,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3a0.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(*(long *)&((local_3a0.
                                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl + 8)
        )();
      }
      local_3a0.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar1.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_328 + 0x10);
  local_328._0_8_ = sVar1.ptr_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,"76a914ef286e6af39de178d88b32e120f716b53753808c88ac","");
  cfd::core::Script::Script(&local_360,(string *)local_328);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_ !=
      sVar1.ptr_) {
    operator_delete((void *)local_328._0_8_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2shAddress((Address *)local_328,&local_388,&local_360);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch(&local_2b0);
      if (local_2c8 != (pointer)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (pointer)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (pointer)0x0) {
        operator_delete(local_2f8);
      }
      if ((char *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d9,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a0,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kMainnet);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1da,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kTestnet);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1db,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kRegtest);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1dc,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ =
       (internal)cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kLiquidV1)
  ;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)local_3a0.
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1dd,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kElementsRegtest)
  ;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1de,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1df,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_3a0.
                         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,!bVar2);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e0,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2wshAddress((Address *)local_328,&local_388,&local_360);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch(&local_2b0);
      if (local_2c8 != (pointer)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (pointer)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (pointer)0x0) {
        operator_delete(local_2f8);
      }
      if ((char *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e2,
               "Expected: addr = factory.CreateP2wshAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a0,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kMainnet);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e3,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kTestnet);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e4,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kRegtest);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e5,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ =
       (internal)cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kLiquidV1)
  ;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)local_3a0.
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e6,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kElementsRegtest)
  ;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e7,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e8,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_3a0.
                         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,!bVar2);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e9,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::GetElementsAddressFormatList();
  cfd::AddressFactory::AddressFactory((AddressFactory *)local_328,kElementsRegtest,&local_3a0);
  sVar1.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_328 + 0x10);
  local_388.type_ = local_328._8_4_;
  local_388.wit_ver_ = local_328._12_4_;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
  operator=(&local_388.prefix_list_,
            (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            sVar1.ptr_);
  local_328._0_8_ = &PTR__AddressFactory_00733578;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             sVar1.ptr_);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_3a0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2pkhAddress((Address *)local_328,&local_388,&local_1b0);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch(&local_2b0);
      if (local_2c8 != (pointer)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (pointer)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (pointer)0x0) {
        operator_delete(local_2f8);
      }
      if ((char *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ec,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a0,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kMainnet);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ed,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kTestnet);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ee,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kRegtest);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ef,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kLiquidV1);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f0,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ =
       (internal)
       cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kElementsRegtest);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)local_3a0.
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f1,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f2,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_3a0.
                         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,!bVar2);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,499,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2wpkhAddress((Address *)local_328,&local_388,&local_1b0);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch(&local_2b0);
      if (local_2c8 != (pointer)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (pointer)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (pointer)0x0) {
        operator_delete(local_2f8);
      }
      if ((char *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f5,
               "Expected: addr = factory.CreateP2wpkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a0,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kMainnet);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f6,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kTestnet);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f7,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kRegtest);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f8,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kLiquidV1);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f9,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ =
       (internal)
       cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kElementsRegtest);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)local_3a0.
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1fa,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1fb,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_3a0.
                         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,!bVar2);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1fc,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2shAddress((Address *)local_328,&local_388,&local_360);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch(&local_2b0);
      if (local_2c8 != (pointer)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (pointer)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (pointer)0x0) {
        operator_delete(local_2f8);
      }
      if ((char *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1fe,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a0,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kMainnet);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ff,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kTestnet);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x200,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kRegtest);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x201,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kLiquidV1);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x202,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ =
       (internal)
       cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kElementsRegtest);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)local_3a0.
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x203,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x204,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_3a0.
                         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,!bVar2);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x205,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2wshAddress((Address *)local_328,&local_388,&local_360);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch(&local_2b0);
      if (local_2c8 != (pointer)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (pointer)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (pointer)0x0) {
        operator_delete(local_2f8);
      }
      if ((char *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x207,
               "Expected: addr = factory.CreateP2wshAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a0,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kMainnet);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x208,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kTestnet);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x209,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kRegtest);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x20a,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kLiquidV1);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x20b,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ =
       (internal)
       cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kElementsRegtest);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)local_3a0.
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x20c,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)!bVar2;
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x20d,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::AddressFactory::CheckAddressNetType(&local_388,(Address *)local_198,kCustomChain);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_3a0.
                         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,!bVar2);
  local_3a0.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x20e,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::~Script(&local_360);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_50);
  cfd::core::Script::~Script(&local_90);
  local_120._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_a8);
  cfd::core::TapBranch::~TapBranch(&local_120);
  if (local_138 != (pointer)0x0) {
    operator_delete(local_138);
  }
  if (local_150 != (pointer)0x0) {
    operator_delete(local_150);
  }
  if (local_168 != (_Base_ptr)0x0) {
    operator_delete(local_168);
  }
  if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
    operator_delete((void *)local_188._0_8_);
  }
  if (local_1b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_388._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_388.prefix_list_);
  return;
}

Assistant:

TEST(AddressFactory, CheckAddressNetType_elements)
{
  AddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList());
  Pubkey pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  Address addr;
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  Script script = Script("76a914ef286e6af39de178d88b32e120f716b53753808c88ac");
  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  factory = AddressFactory(NetType::kElementsRegtest, GetElementsAddressFormatList());
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));
}